

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  long lVar3;
  ulong uVar4;
  string origStr;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  long local_38;
  
  lVar3 = std::__cxx11::string::find((char *)str,(ulong)(replaceThis->_M_dataplus)._M_p,0);
  if (lVar3 != -1) {
    local_58 = &local_48;
    psVar2 = (size_type *)(str->_M_dataplus)._M_p;
    paVar1 = &str->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2 == paVar1) {
      local_48 = paVar1->_M_allocated_capacity;
      uStack_40 = *(undefined8 *)((long)&str->field_2 + 8);
    }
    else {
      local_48 = paVar1->_M_allocated_capacity;
      local_58 = psVar2;
    }
    local_50 = str->_M_string_length;
    (str->_M_dataplus)._M_p = (pointer)paVar1;
    str->_M_string_length = 0;
    (str->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)str);
    uVar4 = 0;
    local_38 = lVar3;
    do {
      std::__cxx11::string::append((string *)str,(ulong)&local_58,uVar4);
      std::__cxx11::string::_M_append((char *)str,(ulong)(withThis->_M_dataplus)._M_p);
      uVar4 = lVar3 + replaceThis->_M_string_length;
      if (local_50 <= uVar4) break;
      lVar3 = std::__cxx11::string::find
                        ((char *)&local_58,(ulong)(replaceThis->_M_dataplus)._M_p,uVar4);
    } while (lVar3 != -1);
    lVar3 = local_38;
    if (uVar4 < local_50) {
      std::__cxx11::string::append((string *)str,(ulong)&local_58,uVar4);
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,local_48 + 1);
    }
  }
  return lVar3 != -1;
}

Assistant:

bool replaceInPlace( std::string& str, std::string const& replaceThis, std::string const& withThis ) {
        std::size_t i = str.find( replaceThis );
        if (i == std::string::npos) {
            return false;
        }
        std::size_t copyBegin = 0;
        std::string origStr = CATCH_MOVE(str);
        str.clear();
        // There is at least one replacement, so reserve with the best guess
        // we can make without actually counting the number of occurences.
        str.reserve(origStr.size() - replaceThis.size() + withThis.size());
        do {
            str.append(origStr, copyBegin, i-copyBegin );
            str += withThis;
            copyBegin = i + replaceThis.size();
            if( copyBegin < origStr.size() )
                i = origStr.find( replaceThis, copyBegin );
            else
                i = std::string::npos;
        } while( i != std::string::npos );
        if ( copyBegin < origStr.size() ) {
            str.append(origStr, copyBegin, origStr.size() );
        }
        return true;
    }